

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_serializer.cpp
# Opt level: O1

void __thiscall
duckdb::BinarySerializer::WriteDataPtr(BinarySerializer *this,const_data_ptr_t ptr,idx_t count)

{
  bool bVar1;
  idx_t iVar2;
  long lVar3;
  uint8_t buffer [16];
  byte local_28 [16];
  
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_28[4] = 0;
  local_28[5] = 0;
  local_28[6] = 0;
  local_28[7] = 0;
  local_28[8] = 0;
  local_28[9] = 0;
  local_28[10] = 0;
  local_28[0xb] = 0;
  local_28[0xc] = 0;
  local_28[0xd] = 0;
  local_28[0xe] = 0;
  local_28[0xf] = 0;
  lVar3 = 0;
  iVar2 = count;
  do {
    local_28[lVar3] = (0x7f < iVar2) << 7 | (byte)iVar2 & 0x7f;
    lVar3 = lVar3 + 1;
    bVar1 = 0x7f < iVar2;
    iVar2 = iVar2 >> 7;
  } while (bVar1);
  (**this->stream->_vptr_WriteStream)(this->stream,local_28);
  (**this->stream->_vptr_WriteStream)(this->stream,ptr,count);
  return;
}

Assistant:

void BinarySerializer::WriteDataPtr(const_data_ptr_t ptr, idx_t count) {
	VarIntEncode(static_cast<uint64_t>(count));
	WriteData(ptr, count);
}